

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

int tinyformat::detail::parseIntAndAdvance(char **c)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  pcVar2 = *c;
  while( true ) {
    if (9 < (byte)(*pcVar2 - 0x30U)) break;
    iVar3 = (uint)(byte)(*pcVar2 - 0x30U) + iVar3 * 10;
    *c = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline int parseIntAndAdvance(const char*& c)
{
    int i = 0;
    for (;*c >= '0' && *c <= '9'; ++c)
        i = 10*i + (*c - '0');
    return i;
}